

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O2

int Nwk_ManPushBackwardFast_rec(Nwk_Obj_t *pObj,Nwk_Obj_t *pPred)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = pObj->pMan->nTravIds;
  iVar4 = 0;
  if (pObj->TravId != iVar1) {
    pObj->TravId = iVar1;
    uVar2 = *(uint *)&pObj->field_0x20;
    if ((uVar2 & 0x20) == 0) {
      if ((uVar2 & 0x10) == 0) {
        lVar3 = 0;
        do {
          if (pObj->nFanins <= lVar3) {
            return 0;
          }
          if (pObj->pFanio[lVar3] == (Nwk_Obj_t *)0x0) {
            return 0;
          }
          iVar1 = Nwk_ManPushBackwardFast_rec(pObj->pFanio[lVar3],pObj);
          lVar3 = lVar3 + 1;
        } while (iVar1 == 0);
        uVar2 = *(uint *)&pObj->field_0x20;
      }
      *(uint *)&pObj->field_0x20 = uVar2 | 0x20;
      pObj->pCopy = pPred;
      iVar4 = 1;
    }
  }
  return iVar4;
}

Assistant:

int Nwk_ManPushBackwardFast_rec( Nwk_Obj_t * pObj, Nwk_Obj_t * pPred )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return 0;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjHasFlow(pObj) )
        return 0;
    if ( Nwk_ObjIsSink(pObj) )
    {
        Nwk_ObjSetFlow(pObj);
        return Nwk_ObjSetPred( pObj, pPred );
    }
    Nwk_ObjForEachFanin( pObj, pNext, i )
        if ( Nwk_ManPushBackwardFast_rec( pNext, pObj ) )
        {
            Nwk_ObjSetFlow(pObj);
            return Nwk_ObjSetPred( pObj, pPred );
        }
    return 0;
}